

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O2

int mbedtls_mpi_core_fill_random
              (mbedtls_mpi_uint *X,size_t X_limbs,size_t n_bytes,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  ulong A_limbs;
  size_t __n;
  
  A_limbs = ((n_bytes >> 3) + 1) - (ulong)((n_bytes & 7) == 0);
  if (X_limbs < A_limbs) {
    iVar1 = -4;
  }
  else {
    __n = A_limbs * 8 - n_bytes;
    memset(X,0,__n);
    memset(X + A_limbs,0,(X_limbs - A_limbs) * 8);
    iVar1 = (*f_rng)(p_rng,(uchar *)(__n + (long)X),n_bytes);
    if (iVar1 == 0) {
      mbedtls_mpi_core_bigendian_to_host(X,A_limbs);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_core_fill_random(
    mbedtls_mpi_uint *X, size_t X_limbs,
    size_t n_bytes,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(n_bytes);
    const size_t overhead = (limbs * ciL) - n_bytes;

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    memset(X, 0, overhead);
    memset((unsigned char *) X + limbs * ciL, 0, (X_limbs - limbs) * ciL);
    MBEDTLS_MPI_CHK(f_rng(p_rng, (unsigned char *) X + overhead, n_bytes));
    mbedtls_mpi_core_bigendian_to_host(X, limbs);

cleanup:
    return ret;
}